

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar2;
  TimeInMillis TVar3;
  OsStackTraceGetterInterface *pOVar4;
  Test *this_03;
  TimeInMillis TVar5;
  Test *test;
  TimeInMillis start;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestInfo *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_00,this);
    this_01 = UnitTest::GetInstance();
    this_02 = UnitTest::listeners(this_01);
    pTVar2 = TestEventListeners::repeater(this_02);
    (*pTVar2->_vptr_TestEventListener[7])(pTVar2,this);
    TVar3 = internal::GetTimeInMillis();
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
    this_03 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    if ((this_03 != (Test *)0x0) && (bVar1 = Test::HasFatalFailure(), !bVar1)) {
      Test::Run(this_03);
    }
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this_03,0x2032b0,(char *)0x0);
    TVar5 = internal::GetTimeInMillis();
    TestResult::set_elapsed_time(&this->result_,TVar5 - TVar3);
    (*pTVar2->_vptr_TestEventListener[9])(pTVar2,this);
    internal::UnitTestImpl::set_current_test_info(this_00,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test only if the test object was created and its
  // constructor didn't generate a fatal failure.
  if ((test != NULL) && !Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  // Deletes the test object.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}